

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

void __thiscall
wasm::TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::stepToNext
          (TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *this)

{
  HeapType type;
  pointer pHVar1;
  
  pHVar1 = (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if ((this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
        _M_impl.super__Vector_impl_data._M_start == pHVar1) {
      return;
    }
    type.id = pHVar1[-1].id;
    SubTypes::getSubTypesFirstSort()::HeapType_(this,type);
    pHVar1 = (this->workStack).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  } while (pHVar1[-1].id != type.id);
  return;
}

Assistant:

void stepToNext() {
    while (!workStack.empty()) {
      T item = workStack.back();
      static_cast<Subtype*>(this)->pushPredecessors(item);
      if (workStack.back() == item) {
        // No unfinished predecessors, so this is the next item in the sort.
        break;
      }
    }
  }